

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

int datephrase(gdstate *gds)

{
  gdstate *gds_local;
  
  if ((((gds->tokenp->token == 0x10b) && (gds->tokenp[1].token == 0x2f)) &&
      (gds->tokenp[2].token == 0x10b)) &&
     ((gds->tokenp[3].token == 0x2f && (gds->tokenp[4].token == 0x10b)))) {
    gds->HaveYear = gds->HaveYear + 1;
    gds->HaveMonth = gds->HaveMonth + 1;
    gds->HaveDay = gds->HaveDay + 1;
    if (gds->tokenp->value < 0xd) {
      if ((gds->tokenp[4].value < 0xd) && (gds->tokenp[2].value < 0xd)) {
        gds->Month = gds->tokenp->value;
        gds->Day = gds->tokenp[2].value;
        gds->Year = gds->tokenp[4].value;
      }
      else {
        gds->Month = gds->tokenp->value;
        gds->Day = gds->tokenp[2].value;
        gds->Year = gds->tokenp[4].value;
      }
    }
    else {
      gds->Year = gds->tokenp->value;
      gds->Month = gds->tokenp[2].value;
      gds->Day = gds->tokenp[4].value;
    }
    gds->tokenp = gds->tokenp + 5;
    gds_local._4_4_ = 1;
  }
  else if ((gds->tokenp->token == 0x10b) &&
          ((gds->tokenp[1].token == 0x2f && (gds->tokenp[2].token == 0x10b)))) {
    gds->HaveMonth = gds->HaveMonth + 1;
    gds->HaveDay = gds->HaveDay + 1;
    gds->Month = gds->tokenp->value;
    gds->Day = gds->tokenp[2].value;
    gds->tokenp = gds->tokenp + 3;
    gds_local._4_4_ = 1;
  }
  else if ((gds->tokenp->token == 0x10b) &&
          ((((gds->tokenp[1].token == 0x2d && (gds->tokenp[2].token == 0x10b)) &&
            (gds->tokenp[3].token == 0x2d)) && (gds->tokenp[4].token == 0x10b)))) {
    gds->HaveYear = gds->HaveYear + 1;
    gds->HaveMonth = gds->HaveMonth + 1;
    gds->HaveDay = gds->HaveDay + 1;
    gds->Year = gds->tokenp->value;
    gds->Month = gds->tokenp[2].value;
    gds->Day = gds->tokenp[4].value;
    gds->tokenp = gds->tokenp + 5;
    gds_local._4_4_ = 1;
  }
  else if (((gds->tokenp->token == 0x10b) && (gds->tokenp[1].token == 0x2d)) &&
          ((gds->tokenp[2].token == 0x108 &&
           ((gds->tokenp[3].token == 0x2d && (gds->tokenp[4].token == 0x10b)))))) {
    gds->HaveYear = gds->HaveYear + 1;
    gds->HaveMonth = gds->HaveMonth + 1;
    gds->HaveDay = gds->HaveDay + 1;
    if (gds->tokenp->value < 0x20) {
      gds->Day = gds->tokenp->value;
      gds->Month = gds->tokenp[2].value;
      gds->Year = gds->tokenp[4].value;
    }
    else {
      gds->Year = gds->tokenp->value;
      gds->Month = gds->tokenp[2].value;
      gds->Day = gds->tokenp[4].value;
    }
    gds->tokenp = gds->tokenp + 5;
    gds_local._4_4_ = 1;
  }
  else if ((gds->tokenp->token == 0x108) &&
          (((gds->tokenp[1].token == 0x10b && (gds->tokenp[2].token == 0x2c)) &&
           (gds->tokenp[3].token == 0x10b)))) {
    gds->HaveYear = gds->HaveYear + 1;
    gds->HaveMonth = gds->HaveMonth + 1;
    gds->HaveDay = gds->HaveDay + 1;
    gds->Month = gds->tokenp->value;
    gds->Day = gds->tokenp[1].value;
    gds->Year = gds->tokenp[3].value;
    gds->tokenp = gds->tokenp + 4;
    gds_local._4_4_ = 1;
  }
  else if ((gds->tokenp->token == 0x108) && (gds->tokenp[1].token == 0x10b)) {
    gds->HaveMonth = gds->HaveMonth + 1;
    gds->HaveDay = gds->HaveDay + 1;
    gds->Month = gds->tokenp->value;
    gds->Day = gds->tokenp[1].value;
    gds->tokenp = gds->tokenp + 2;
    gds_local._4_4_ = 1;
  }
  else if ((gds->tokenp->token == 0x10b) &&
          ((gds->tokenp[1].token == 0x108 && (gds->tokenp[2].token == 0x10b)))) {
    gds->HaveYear = gds->HaveYear + 1;
    gds->HaveMonth = gds->HaveMonth + 1;
    gds->HaveDay = gds->HaveDay + 1;
    gds->Day = gds->tokenp->value;
    gds->Month = gds->tokenp[1].value;
    gds->Year = gds->tokenp[2].value;
    gds->tokenp = gds->tokenp + 3;
    gds_local._4_4_ = 1;
  }
  else if ((gds->tokenp->token == 0x10b) && (gds->tokenp[1].token == 0x108)) {
    gds->HaveMonth = gds->HaveMonth + 1;
    gds->HaveDay = gds->HaveDay + 1;
    gds->Day = gds->tokenp->value;
    gds->Month = gds->tokenp[1].value;
    gds->tokenp = gds->tokenp + 2;
    gds_local._4_4_ = 1;
  }
  else {
    gds_local._4_4_ = 0;
  }
  return gds_local._4_4_;
}

Assistant:

static int
datephrase(struct gdstate *gds)
{
	if (gds->tokenp[0].token == tUNUMBER
	    && gds->tokenp[1].token == '/'
	    && gds->tokenp[2].token == tUNUMBER
	    && gds->tokenp[3].token == '/'
	    && gds->tokenp[4].token == tUNUMBER) {
		gds->HaveYear++;
		gds->HaveMonth++;
		gds->HaveDay++;
		if (gds->tokenp[0].value >= 13) {
			/* First number is big:  2004/01/29, 99/02/17 */
			gds->Year = gds->tokenp[0].value;
			gds->Month = gds->tokenp[2].value;
			gds->Day = gds->tokenp[4].value;
		} else if ((gds->tokenp[4].value >= 13)
		    || (gds->tokenp[2].value >= 13)) {
			/* Last number is big:  01/07/98 */
			/* Middle number is big:  01/29/04 */
			gds->Month = gds->tokenp[0].value;
			gds->Day = gds->tokenp[2].value;
			gds->Year = gds->tokenp[4].value;
		} else {
			/* No significant clues: 02/03/04 */
			gds->Month = gds->tokenp[0].value;
			gds->Day = gds->tokenp[2].value;
			gds->Year = gds->tokenp[4].value;
		}
		gds->tokenp += 5;
		return 1;
	}

	if (gds->tokenp[0].token == tUNUMBER
	    && gds->tokenp[1].token == '/'
	    && gds->tokenp[2].token == tUNUMBER) {
		/* "1/15" */
		gds->HaveMonth++;
		gds->HaveDay++;
		gds->Month = gds->tokenp[0].value;
		gds->Day = gds->tokenp[2].value;
		gds->tokenp += 3;
		return 1;
	}

	if (gds->tokenp[0].token == tUNUMBER
	    && gds->tokenp[1].token == '-'
	    && gds->tokenp[2].token == tUNUMBER
	    && gds->tokenp[3].token == '-'
	    && gds->tokenp[4].token == tUNUMBER) {
		/* ISO 8601 format.  yyyy-mm-dd.  */
		gds->HaveYear++;
		gds->HaveMonth++;
		gds->HaveDay++;
		gds->Year = gds->tokenp[0].value;
		gds->Month = gds->tokenp[2].value;
		gds->Day = gds->tokenp[4].value;
		gds->tokenp += 5;
		return 1;
	}

	if (gds->tokenp[0].token == tUNUMBER
	    && gds->tokenp[1].token == '-'
	    && gds->tokenp[2].token == tMONTH
	    && gds->tokenp[3].token == '-'
	    && gds->tokenp[4].token == tUNUMBER) {
		gds->HaveYear++;
		gds->HaveMonth++;
		gds->HaveDay++;
		if (gds->tokenp[0].value > 31) {
			/* e.g. 1992-Jun-17 */
			gds->Year = gds->tokenp[0].value;
			gds->Month = gds->tokenp[2].value;
			gds->Day = gds->tokenp[4].value;
		} else {
			/* e.g. 17-JUN-1992.  */
			gds->Day = gds->tokenp[0].value;
			gds->Month = gds->tokenp[2].value;
			gds->Year = gds->tokenp[4].value;
		}
		gds->tokenp += 5;
		return 1;
	}

	if (gds->tokenp[0].token == tMONTH
	    && gds->tokenp[1].token == tUNUMBER
	    && gds->tokenp[2].token == ','
	    && gds->tokenp[3].token == tUNUMBER) {
		/* "June 17, 2001" */
		gds->HaveYear++;
		gds->HaveMonth++;
		gds->HaveDay++;
		gds->Month = gds->tokenp[0].value;
		gds->Day = gds->tokenp[1].value;
		gds->Year = gds->tokenp[3].value;
		gds->tokenp += 4;
		return 1;
	}

	if (gds->tokenp[0].token == tMONTH
	    && gds->tokenp[1].token == tUNUMBER) {
		/* "May 3" */
		gds->HaveMonth++;
		gds->HaveDay++;
		gds->Month = gds->tokenp[0].value;
		gds->Day = gds->tokenp[1].value;
		gds->tokenp += 2;
		return 1;
	}

	if (gds->tokenp[0].token == tUNUMBER
	    && gds->tokenp[1].token == tMONTH
	    && gds->tokenp[2].token == tUNUMBER) {
		/* "12 Sept 1997" */
		gds->HaveYear++;
		gds->HaveMonth++;
		gds->HaveDay++;
		gds->Day = gds->tokenp[0].value;
		gds->Month = gds->tokenp[1].value;
		gds->Year = gds->tokenp[2].value;
		gds->tokenp += 3;
		return 1;
	}

	if (gds->tokenp[0].token == tUNUMBER
	    && gds->tokenp[1].token == tMONTH) {
		/* "12 Sept" */
		gds->HaveMonth++;
		gds->HaveDay++;
		gds->Day = gds->tokenp[0].value;
		gds->Month = gds->tokenp[1].value;
		gds->tokenp += 2;
		return 1;
	}

	return 0;
}